

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectSkinWeights(XFileParser *this,Mesh *pMesh)

{
  vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_> *this_00;
  pointer *ppBVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pBVar3;
  iterator __position;
  uint uVar4;
  uint uVar5;
  uint a;
  ulong uVar6;
  ulong __n;
  ai_real aVar7;
  string transformNodeName;
  BoneWeight weight;
  string local_c8;
  Bone local_a8;
  
  if (pMesh != (Mesh *)0x0) {
    readHeadOfDataObject(this,(string *)0x0);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    GetNextTokenAsString(this,&local_c8);
    paVar2 = &local_a8.mName.field_2;
    local_a8.mName.field_2._8_8_ = 0;
    local_a8.mOffsetMatrix.b3 = 0.0;
    local_a8.mOffsetMatrix.b4 = 0.0;
    local_a8.mOffsetMatrix.c1 = 0.0;
    local_a8.mOffsetMatrix.c2 = 0.0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.mName._M_string_length = 0;
    local_a8.mName.field_2._M_allocated_capacity = 0;
    local_a8.mWeights.
    super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.mOffsetMatrix.a1 = 1.0;
    local_a8.mOffsetMatrix.a2 = 0.0;
    local_a8.mOffsetMatrix.a3 = 0.0;
    local_a8.mOffsetMatrix.a4 = 0.0;
    local_a8.mOffsetMatrix.b1 = 0.0;
    local_a8.mOffsetMatrix.b2 = 1.0;
    local_a8.mOffsetMatrix.c3 = 1.0;
    local_a8.mOffsetMatrix.c4 = 0.0;
    local_a8.mOffsetMatrix.d1 = 0.0;
    local_a8.mOffsetMatrix.d2 = 0.0;
    local_a8.mOffsetMatrix.d3 = 0.0;
    local_a8.mOffsetMatrix.d4 = 1.0;
    local_a8.mName._M_dataplus._M_p = (pointer)paVar2;
    std::vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>::
    emplace_back<Assimp::XFile::Bone>(&pMesh->mBones,&local_a8);
    if (local_a8.mWeights.
        super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.mWeights.
                      super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mName._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8.mName._M_dataplus._M_p);
    }
    pBVar3 = (pMesh->mBones).
             super__Vector_base<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_assign((string *)(pBVar3 + -1));
    uVar4 = ReadInt(this);
    this_00 = &pBVar3[-1].mWeights;
    __n = (ulong)uVar4;
    std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::reserve
              (this_00,__n);
    if (uVar4 != 0) {
      do {
        uVar5 = ReadInt(this);
        local_a8.mName._M_dataplus._M_p._0_4_ = uVar5;
        __position._M_current =
             pBVar3[-1].mWeights.
             super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            pBVar3[-1].mWeights.
            super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::XFile::BoneWeight,std::allocator<Assimp::XFile::BoneWeight>>::
          _M_realloc_insert<Assimp::XFile::BoneWeight_const&>
                    ((vector<Assimp::XFile::BoneWeight,std::allocator<Assimp::XFile::BoneWeight>> *)
                     this_00,__position,(BoneWeight *)&local_a8);
        }
        else {
          *__position._M_current = (BoneWeight)local_a8.mName._M_dataplus._M_p;
          ppBVar1 = &pBVar3[-1].mWeights.
                     super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar6 = 0;
      do {
        aVar7 = ReadFloat(this);
        (this_00->
        super__Vector_base<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar6].mWeight = aVar7;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.a1 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.b1 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.c1 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.d1 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.a2 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.b2 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.c2 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.d2 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.a3 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.b3 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.c3 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.d3 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.a4 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.b4 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.c4 = aVar7;
    aVar7 = ReadFloat(this);
    pBVar3[-1].mOffsetMatrix.d4 = aVar7;
    CheckForSemicolon(this);
    CheckForClosingBrace(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectSkinWeights( Mesh *pMesh) {
    if ( nullptr == pMesh ) {
        return;
    }
    readHeadOfDataObject();

    std::string transformNodeName;
    GetNextTokenAsString( transformNodeName);

    pMesh->mBones.push_back( Bone());
    Bone& bone = pMesh->mBones.back();
    bone.mName = transformNodeName;

    // read vertex weights
    unsigned int numWeights = ReadInt();
    bone.mWeights.reserve( numWeights);

    for( unsigned int a = 0; a < numWeights; a++)
    {
        BoneWeight weight;
        weight.mVertex = ReadInt();
        bone.mWeights.push_back( weight);
    }

    // read vertex weights
    for( unsigned int a = 0; a < numWeights; a++)
        bone.mWeights[a].mWeight = ReadFloat();

    // read matrix offset
    bone.mOffsetMatrix.a1 = ReadFloat(); bone.mOffsetMatrix.b1 = ReadFloat();
    bone.mOffsetMatrix.c1 = ReadFloat(); bone.mOffsetMatrix.d1 = ReadFloat();
    bone.mOffsetMatrix.a2 = ReadFloat(); bone.mOffsetMatrix.b2 = ReadFloat();
    bone.mOffsetMatrix.c2 = ReadFloat(); bone.mOffsetMatrix.d2 = ReadFloat();
    bone.mOffsetMatrix.a3 = ReadFloat(); bone.mOffsetMatrix.b3 = ReadFloat();
    bone.mOffsetMatrix.c3 = ReadFloat(); bone.mOffsetMatrix.d3 = ReadFloat();
    bone.mOffsetMatrix.a4 = ReadFloat(); bone.mOffsetMatrix.b4 = ReadFloat();
    bone.mOffsetMatrix.c4 = ReadFloat(); bone.mOffsetMatrix.d4 = ReadFloat();

    CheckForSemicolon();
    CheckForClosingBrace();
}